

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall gui::DialogBox::draw(DialogBox *this)

{
  RenderTarget *in_stack_00000068;
  DialogBox *in_stack_00000070;
  undefined1 in_stack_00000080 [104];
  
  draw(in_stack_00000070,in_stack_00000068,(RenderStates)in_stack_00000080);
  return;
}

Assistant:

void DialogBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);
    float outlineThickness = style_->rect_.getOutlineThickness();
    style_->titleBar_.setPosition(-outlineThickness, -outlineThickness);
    style_->titleBar_.setSize({size_.x + outlineThickness * 2.0f, style_->titleBarHeight_});
    target.draw(style_->titleBar_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}